

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

bool __thiscall wirehair::Codec::AllocateWorkspace(Codec *this)

{
  ushort uVar1;
  uint8_t *puVar2;
  PeelRow *pPVar3;
  PeelRefs *pPVar4;
  long lVar5;
  uint ii;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong size;
  ulong uVar9;
  
  uVar1 = this->_block_count;
  uVar9 = (ulong)uVar1;
  uVar7 = uVar1 + 1 + (uint)this->_mix_count;
  lVar8 = (ulong)this->_block_bytes * (ulong)uVar7;
  uVar6 = (ulong)((uint)this->_extra_count + (uint)uVar1);
  size = uVar9 * 0x48 + uVar6 * 0x19 + lVar8;
  if (this->_workspace_allocated < size) {
    FreeWorkspace(this);
    puVar2 = SIMDSafeAllocate(size);
    this->_recovery_blocks = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      return false;
    }
    this->_workspace_allocated = size;
  }
  else {
    puVar2 = this->_recovery_blocks;
  }
  this->_peel_rows = (PeelRow *)(puVar2 + lVar8);
  pPVar3 = (PeelRow *)(puVar2 + lVar8) + uVar6;
  this->_peel_cols = (PeelColumn *)pPVar3;
  pPVar4 = (PeelRefs *)((long)&pPVar3->RecoveryId + uVar9 * 6);
  this->_peel_col_refs = pPVar4;
  lVar8 = 0;
  this->_copied_original = (uint8_t *)(pPVar4 + uVar9);
  lVar5 = 0;
  this->_recovery_rows = uVar7;
  for (uVar6 = 0; uVar6 < this->_block_count; uVar6 = uVar6 + 1) {
    *(undefined2 *)((long)this->_peel_col_refs->Rows + lVar5 + -2) = 0;
    puVar2 = (uint8_t *)((long)&pPVar3->RecoveryId + lVar8 + 2);
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    lVar5 = lVar5 + 0x42;
    pPVar3 = (PeelRow *)this->_peel_cols;
    *(undefined1 *)((long)&pPVar3->NextRow + lVar8) = 0;
    lVar8 = lVar8 + 6;
  }
  return true;
}

Assistant:

bool Codec::AllocateWorkspace()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateWorkspace ----" << endl << endl;)

    // +1 for temporary space for MultiplyDenseValues()
    const unsigned recovery_rows = _block_count + _mix_count + 1;
    const uint64_t recoverySizeBytes = static_cast<uint64_t>(recovery_rows) * _block_bytes;

    // Count needed rows and columns
    const uint32_t row_count = _block_count + _extra_count;
    const uint32_t column_count = _block_count;

    // Calculate size
    const uint64_t sizeBytes = recoverySizeBytes
        + sizeof(PeelRow) * row_count
        + sizeof(PeelColumn) * column_count
        + sizeof(PeelRefs) * column_count
        + row_count;

    if (_workspace_allocated < sizeBytes)
    {
        FreeWorkspace();

        // Allocate workspace
        _recovery_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_recovery_blocks) {
            return false;
        }
        _workspace_allocated = sizeBytes;
    }

    // Set pointers
    _peel_rows = reinterpret_cast<PeelRow *>( _recovery_blocks + recoverySizeBytes );
    _peel_cols = reinterpret_cast<PeelColumn *>( _peel_rows + row_count );
    _peel_col_refs = reinterpret_cast<PeelRefs *>( _peel_cols + column_count );
    _copied_original = reinterpret_cast<uint8_t *>( _peel_col_refs + column_count );

    _recovery_rows = recovery_rows;

    CAT_IF_DUMP(cout << "Memory overhead for workspace = " << sizeBytes << " bytes" << endl;)

    // Initialize columns
    for (unsigned ii = 0; ii < _block_count; ++ii)
    {
        _peel_col_refs[ii].RowCount = 0;
        _peel_cols[ii].Weight2Refs = 0;
        _peel_cols[ii].Mark = MARK_TODO;
    }

    return true;
}